

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vdpu384a_com.c
# Opt level: O1

void vdpu384a_update_thumbnail_frame_info(MppFrame frame)

{
  RK_U32 RVar1;
  RK_U32 RVar2;
  MppFrameFormat MVar3;
  RK_U32 val;
  RK_U32 RVar4;
  
  RVar1 = mpp_frame_get_height(frame);
  RVar2 = mpp_frame_get_width(frame);
  val = (RVar2 >> 1) + 0xf & 0xfffffff0;
  MVar3 = mpp_frame_get_fmt(frame);
  if ((MVar3 & 0xf00000) == MPP_FMT_YUV420SP) {
    val = mpp_align_128_odd_plus_64(val);
    RVar4 = mpp_frame_get_ver_stride(frame);
    RVar4 = RVar4 >> 1;
  }
  else {
    RVar4 = (RVar1 >> 1) + 0xf & 0xfffffff0;
  }
  mpp_frame_set_fmt(frame,MPP_FMT_YUV420SP);
  mpp_frame_set_width(frame,RVar2 >> 1);
  mpp_frame_set_height(frame,RVar1 >> 1);
  mpp_frame_set_hor_stride(frame,val);
  mpp_frame_set_ver_stride(frame,RVar4);
  mpp_frame_set_buf_size(frame,(ulong)(RVar4 * val * 3 >> 1));
  return;
}

Assistant:

void vdpu384a_update_thumbnail_frame_info(MppFrame frame)
{
    RK_U32 down_scale_height = mpp_frame_get_height(frame) >> 1;
    RK_U32 down_scale_width = mpp_frame_get_width(frame) >> 1;
    RK_U32 down_scale_ver = MPP_ALIGN(down_scale_height, 16);
    RK_U32 down_scale_hor = MPP_ALIGN(down_scale_width, 16);
    RK_U32 down_scale_buf_size = 0;

    if (!MPP_FRAME_FMT_IS_FBC(mpp_frame_get_fmt(frame))) {
        down_scale_hor = mpp_align_128_odd_plus_64(down_scale_hor);
        down_scale_ver = mpp_frame_get_ver_stride(frame) >> 1;
    }

    down_scale_buf_size = down_scale_hor * down_scale_ver *  3 / 2;
    /*
     *  no matter what format, scale down image will output as 8bit raster format;
     */
    mpp_frame_set_fmt(frame, MPP_FMT_YUV420SP);
    mpp_frame_set_width(frame, down_scale_width);
    mpp_frame_set_height(frame, down_scale_height);
    mpp_frame_set_hor_stride(frame, down_scale_hor);
    mpp_frame_set_ver_stride(frame, down_scale_ver);
    mpp_frame_set_buf_size(frame, down_scale_buf_size);
}